

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O2

size_t HUF_compress1X_usingCTable_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable,int bmi2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  size_t sVar6;
  ulong *puVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  BIT_CStream_t local_40;
  
  if (bmi2 != 0) {
    sVar6 = HUF_compress1X_usingCTable_internal_bmi2(dst,dstSize,src,srcSize,CTable);
    return sVar6;
  }
  if (dstSize < 8) {
    return 0;
  }
  local_40.endPtr = (char *)((long)dst + (dstSize - 8));
  uVar11 = 0;
  if (dstSize == 8) {
    return 0;
  }
  uVar12 = srcSize & 0xfffffffffffffffc;
  uVar5 = (uint)srcSize & 3;
  local_40.bitContainer = (size_t)uVar5;
  local_40.ptr = (char *)dst;
  switch(uVar5) {
  case 0:
    goto switchD_0012b447_caseD_0;
  case 1:
    iVar8 = 0;
    goto LAB_0012b47d;
  case 2:
    uVar5 = 0;
    break;
  case 3:
    bVar1 = *(byte *)((long)src + uVar12 + 2);
    uVar11 = (ulong)CTable[bVar1].val;
    uVar5 = (uint)CTable[bVar1].nbBits;
  }
  bVar1 = *(byte *)((long)src + uVar12 + 1);
  uVar11 = uVar11 | (ulong)CTable[bVar1].val << ((byte)uVar5 & 0x3f);
  iVar8 = CTable[bVar1].nbBits + uVar5;
LAB_0012b47d:
  local_40.bitContainer =
       (ulong)CTable[*(byte *)((long)src + uVar12)].val << ((byte)iVar8 & 0x3f) | uVar11;
  uVar5 = (uint)CTable[*(byte *)((long)src + uVar12)].nbBits + iVar8;
  *(size_t *)dst = local_40.bitContainer;
  local_40.ptr = (char *)((ulong)(uVar5 >> 3) + (long)dst);
  if (local_40.endPtr < local_40.ptr) {
    local_40.ptr = local_40.endPtr;
  }
  uVar11 = (ulong)(uVar5 & 7);
  local_40.bitContainer = local_40.bitContainer >> ((byte)uVar5 & 0x38);
switchD_0012b447_caseD_0:
  while (local_40.bitPos = (uint)uVar11, uVar12 != 0) {
    bVar1 = *(byte *)((long)src + (uVar12 - 1));
    iVar8 = CTable[bVar1].nbBits + local_40.bitPos;
    bVar2 = *(byte *)((long)src + (uVar12 - 2));
    iVar10 = (uint)CTable[bVar2].nbBits + iVar8;
    bVar3 = *(byte *)((long)src + (uVar12 - 3));
    iVar9 = (uint)CTable[bVar3].nbBits + iVar10;
    bVar4 = *(byte *)((long)src + (uVar12 - 4));
    uVar12 = uVar12 - 4;
    local_40.bitContainer =
         (ulong)CTable[bVar4].val << ((byte)iVar9 & 0x3f) |
         (ulong)CTable[bVar3].val << ((byte)iVar10 & 0x3f) |
         (ulong)CTable[bVar2].val << ((byte)iVar8 & 0x3f) |
         (ulong)CTable[bVar1].val << (sbyte)uVar11 | local_40.bitContainer;
    uVar5 = (uint)CTable[bVar4].nbBits + iVar9;
    puVar7 = (ulong *)((ulong)(uVar5 >> 3) + (long)local_40.ptr);
    if (local_40.endPtr < puVar7) {
      puVar7 = (ulong *)local_40.endPtr;
    }
    *(size_t *)local_40.ptr = local_40.bitContainer;
    local_40.bitContainer = local_40.bitContainer >> ((byte)uVar5 & 0x38);
    uVar11 = (ulong)(uVar5 & 7);
    local_40.ptr = (char *)puVar7;
  }
  local_40.startPtr = (char *)dst;
  sVar6 = BIT_closeCStream(&local_40);
  return sVar6;
}

Assistant:

static size_t
HUF_compress1X_usingCTable_internal(void* dst, size_t dstSize,
                              const void* src, size_t srcSize,
                              const HUF_CElt* CTable, const int bmi2)
{
    if (bmi2) {
        return HUF_compress1X_usingCTable_internal_bmi2(dst, dstSize, src, srcSize, CTable);
    }
    return HUF_compress1X_usingCTable_internal_default(dst, dstSize, src, srcSize, CTable);
}